

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::TagType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
          *values,TagType *out,char *desc)

{
  TagType *this_00;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  const_reference pvVar4;
  int __c;
  Var *var_00;
  TagType local_98;
  Var local_80;
  char *local_38;
  char *desc_local;
  TagType *out_local;
  vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
  *values_local;
  Var *var_local;
  SharedValidator *this_local;
  Result result;
  
  local_38 = desc;
  desc_local = (char *)out;
  out_local = (TagType *)values;
  values_local = (vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
                  *)var;
  var_local = (Var *)this;
  Var::Var(&local_80,var);
  sVar2 = std::
          vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>::
          size((vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
                *)out_local);
  var_00 = &local_80;
  this_local._4_4_ = CheckIndex(this,var_00,(Index)sVar2,local_38);
  Var::~Var(&local_80);
  if (desc_local != (char *)0x0) {
    bVar1 = Succeeded(this_local._4_4_);
    this_00 = out_local;
    if (bVar1) {
      pcVar3 = Var::index(var,(char *)var_00,__c);
      pvVar4 = std::
               vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
               ::operator[]((vector<wabt::SharedValidator::TagType,_std::allocator<wabt::SharedValidator::TagType>_>
                             *)this_00,(ulong)pcVar3 & 0xffffffff);
      TagType::TagType(&local_98,pvVar4);
    }
    else {
      memset(&local_98,0,0x18);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_98.params);
    }
    TagType::operator=((TagType *)desc_local,&local_98);
    TagType::~TagType(&local_98);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}